

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_paramtype.cc
# Opt level: O2

Type * __thiscall ParameterizedType::DoClone(ParameterizedType *this)

{
  int iVar1;
  ParameterizedType *this_00;
  undefined4 extraout_var;
  int in_ECX;
  void *__child_stack;
  __fn *in_RSI;
  void *in_R8;
  
  this_00 = (ParameterizedType *)operator_new(0x1a8);
  iVar1 = ID::clone(this->type_id_,in_RSI,__child_stack,in_ECX,in_R8);
  ParameterizedType(this_00,(ID *)CONCAT44(extraout_var,iVar1),this->args_);
  return &this_00->super_Type;
}

Assistant:

Type* ParameterizedType::DoClone() const
	{
	return new ParameterizedType(type_id_->clone(), args_);
	}